

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O2

pair<CS248::internal::GLIntId<CS248::internal::TextureArrayTag>,_CS248::internal::GLIntId<CS248::internal::TextureArrayTag>_>
 __thiscall
CS248::GLResourceManager::createDepthAndColorTextureArrayFromFrameBuffers
          (GLResourceManager *this,FrameBufferId *fbids,int num,int texture_size)

{
  TextureId TVar1;
  pair<CS248::internal::GLIntId<CS248::internal::TextureArrayTag>,_CS248::internal::GLIntId<CS248::internal::TextureArrayTag>_>
  pVar2;
  ulong uVar3;
  TextureArrayId texaid;
  undefined8 uVar4;
  GLResourceManager *this_00;
  ulong uVar5;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> tex_bind;
  GLResourceManager *local_40;
  FrameBufferId *local_38;
  
  local_38 = fbids;
  pVar2.first.id = createTexture(this);
  bindTextureArray((GLResourceManager *)&local_40,(TextureArrayId)(GLuint)fbids);
  (*__glewTexImage3D)(0x8c1a,0,0x1902,texture_size,texture_size,num,0,0x1902,0x1406,(void *)0x0);
  glTexParameteri(0x8c1a,0x2800,0x2600);
  glTexParameteri(0x8c1a,0x2801,0x2600);
  glTexParameteri(0x8c1a,0x2802,0x812f);
  texaid.id = 0x2803;
  glTexParameteri(0x8c1a,0x2803,0x812f);
  this_00 = local_40;
  if (local_40 != (GLResourceManager *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  TVar1 = createTexture(this_00);
  bindTextureArray((GLResourceManager *)&local_40,texaid);
  (*__glewTexImage3D)(0x8c1a,0,0x1907,texture_size,texture_size,num,0,0x1908,0x1401,(void *)0x0);
  glTexParameteri(0x8c1a,0x2800,0x2600);
  glTexParameteri(0x8c1a,0x2801,0x2600);
  glTexParameteri(0x8c1a,0x2802,0x812f);
  uVar4 = 0x2803;
  glTexParameteri(0x8c1a,0x2803,0x812f);
  if (local_40 != (GLResourceManager *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  uVar5 = 0;
  uVar3 = (ulong)(uint)num;
  if (num < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    bindFrameBuffer((GLResourceManager *)&local_40,(FrameBufferId)(GLuint)uVar4);
    (*__glewFramebufferTextureLayer)(0x8d40,0x8d00,pVar2.first.id,0,(GLint)uVar5);
    uVar4 = 0x8ce0;
    (*__glewFramebufferTextureLayer)(0x8d40,0x8ce0,TVar1.id,0,(GLint)uVar5);
    if (local_40 != (GLResourceManager *)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  pVar2.second.id = TVar1.id;
  return pVar2;
}

Assistant:

std::pair<TextureArrayId, TextureArrayId> GLResourceManager::createDepthAndColorTextureArrayFromFrameBuffers(const FrameBufferId* fbids, int num, int texture_size) {
  // Texture Array is just one texture
  TextureArrayId depth_id{createTexture().id};
  {
    auto tex_bind = bindTextureArray(depth_id);
    glTexImage3D(GL_TEXTURE_2D_ARRAY, /*level=*/0, GL_DEPTH_COMPONENT, /*width=*/texture_size,
        /*height=*/texture_size, /*depth=*/num, /*border=*/0, GL_DEPTH_COMPONENT, GL_FLOAT, /*data=*/0);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE); 
  }
  TextureArrayId color_id{createTexture().id};
  {
    auto tex_bind = bindTextureArray(color_id);
    glTexImage3D(GL_TEXTURE_2D_ARRAY, /*level=*/0, GL_RGB, /*width=*/texture_size,
        /*height=*/texture_size, /*depth=*/num, /*border=*/0, GL_RGBA, GL_UNSIGNED_BYTE, /*data=*/0);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE); 
  }
  for (int i = 0; i < num; ++i) {
    auto fb_bind = bindFrameBuffer(fbids[i]);
    glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, depth_id.id, /*level=*/0, /*layer=*/i);
    glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, color_id.id, /*level=*/0, /*layer=*/i);
  }
  return std::make_pair(depth_id, color_id);
}